

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_wd_add_subtree(lyd_node **root,lyd_node *last_parent,lyd_node *subroot,lys_node *schema,
                      int toplevel,int options,unres_data *unres)

{
  LYS_NODE LVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  lys_node *plVar5;
  bool bVar6;
  lyd_node *local_70;
  uint local_60;
  int local_5c;
  int check_when_must;
  int i;
  lyd_node *iter;
  lys_node *siter_prev;
  lys_node *siter;
  ly_set *present;
  int options_local;
  int toplevel_local;
  lys_node *schema_local;
  lyd_node *subroot_local;
  lyd_node *last_parent_local;
  lyd_node **root_local;
  
  siter = (lys_node *)0x0;
  if (root == (lyd_node **)0x0) {
    __assert_fail("root",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x1749,
                  "int lyd_wd_add_subtree(struct lyd_node **, struct lyd_node *, struct lyd_node *, struct lys_node *, int, int, struct unres_data *)"
                 );
  }
  if (((options & 0xffU) != 0) && ((schema->flags & 2) != 0)) {
    return 0;
  }
  local_60 = (uint)((options & 0x208eU) == 0);
  if ((toplevel != 0) &&
     ((schema->nodetype & (LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) != LYS_UNKNOWN)) {
    siter = (lys_node *)ly_set_new();
    if (siter != (lys_node *)0x0) {
      if ((*root == (lyd_node *)0x0) ||
         (iVar3 = lyd_get_node_siblings(*root,schema,(ly_set *)siter), iVar3 == 0)) {
        iVar3 = lyd_wd_add_subtree(root,last_parent,(lyd_node *)0x0,schema,0,options,unres);
        if (iVar3 != 0) goto LAB_0019326b;
      }
      else {
        for (local_5c = 0; local_5c < (int)*(uint *)((long)&siter->name + 4);
            local_5c = local_5c + 1) {
          if ((schema->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN) {
            if ((schema->nodetype != LYS_LEAF) &&
               (iVar3 = lyd_wd_add_subtree(root,(lyd_node *)((ly_set_set *)&siter->dsc)->s[local_5c]
                                           ,(lyd_node *)((ly_set_set *)&siter->dsc)->s[local_5c],
                                           schema,0,options,unres), iVar3 != 0)) goto LAB_0019326b;
          }
          else {
            lyd_wd_leaflist_cleanup((ly_set *)siter);
          }
        }
      }
      ly_set_free((ly_set *)siter);
      return 0;
    }
    goto LAB_0019326b;
  }
  if (subroot == (lyd_node *)0x0) {
    if (((schema->parent != (lys_node *)0x0) && (schema->parent->nodetype == LYS_AUGMENT)) &&
       (plVar5 = lys_is_disabled(schema->parent,0), plVar5 != (lys_node *)0x0)) {
      return 0;
    }
    plVar5 = lys_is_disabled(schema,0);
    if (plVar5 != (lys_node *)0x0) {
      return 0;
    }
  }
  LVar1 = schema->nodetype;
  schema_local = (lys_node *)subroot;
  subroot_local = last_parent;
  if (LVar1 == LYS_CONTAINER) {
LAB_00192d8d:
    if (subroot == (lyd_node *)0x0) {
      lVar2._0_2_ = schema[1].flags;
      lVar2._2_1_ = schema[1].ext_size;
      lVar2._3_1_ = schema[1].iffeature_size;
      lVar2._4_1_ = schema[1].padding[0];
      lVar2._5_1_ = schema[1].padding[1];
      lVar2._6_1_ = schema[1].padding[2];
      lVar2._7_1_ = schema[1].padding[3];
      if (lVar2 != 0) goto LAB_00193259;
      schema_local = (lys_node *)_lyd_new(last_parent,schema,1);
      if (last_parent == (lyd_node *)0x0) {
        if (*root == (lyd_node *)0x0) {
          *root = (lyd_node *)schema_local;
        }
        else {
          lyd_insert_sibling(root,(lyd_node *)schema_local);
        }
      }
      subroot_local = (lyd_node *)schema_local;
      if ((local_60 != 0) &&
         (((((*(byte *)((long)&schema_local->dsc + 1) >> 1 & 4) != 0 &&
            (iVar3 = unres_data_add(unres,(lyd_node *)schema_local,UNRES_WHEN), iVar3 == -1)) ||
           ((uVar4 = resolve_applies_must((lyd_node *)schema_local), (uVar4 & 1) != 0 &&
            (iVar3 = unres_data_add(unres,(lyd_node *)schema_local,UNRES_MUST), iVar3 == -1)))) ||
          (((uVar4 & 2) != 0 &&
           (iVar3 = unres_data_add(unres,(lyd_node *)schema_local,UNRES_MUST_INOUT), iVar3 == -1))))
         )) goto LAB_0019326b;
    }
LAB_00192e92:
    siter = (lys_node *)ly_set_new();
    if (siter != (lys_node *)0x0) {
      for (siter_prev = schema->child; siter_prev != (lys_node *)0x0; siter_prev = siter_prev->next)
      {
        if ((siter_prev->nodetype & (LYS_USES|LYS_CHOICE)) == LYS_UNKNOWN) {
          if ((siter_prev->nodetype & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) !=
              LYS_UNKNOWN) {
            if ((schema_local == (lys_node *)0x0) ||
               (iVar3 = lyd_get_node_siblings
                                  ((lyd_node *)schema_local->module,siter_prev,(ly_set *)siter),
               iVar3 == 0)) {
              iVar3 = lyd_wd_add_subtree(root,subroot_local,(lyd_node *)0x0,siter_prev,toplevel,
                                         options,unres);
              goto joined_r0x00193001;
            }
            if ((siter_prev->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN) {
              if (siter_prev->nodetype != LYS_LEAF) {
                for (local_5c = 0; local_5c < (int)*(uint *)((long)&siter->name + 4);
                    local_5c = local_5c + 1) {
                  iVar3 = lyd_wd_add_subtree(root,(lyd_node *)
                                                  ((ly_set_set *)&siter->dsc)->s[local_5c],
                                             (lyd_node *)((ly_set_set *)&siter->dsc)->s[local_5c],
                                             siter_prev,toplevel,options,unres);
                  if (iVar3 != 0) goto LAB_0019326b;
                }
              }
            }
            else {
              lyd_wd_leaflist_cleanup((ly_set *)siter);
            }
            ly_set_clean((ly_set *)siter);
          }
        }
        else {
          iVar3 = lyd_wd_add_subtree(root,subroot_local,(lyd_node *)schema_local,siter_prev,toplevel
                                     ,options,unres);
joined_r0x00193001:
          if (iVar3 != 0) goto LAB_0019326b;
        }
      }
LAB_00193259:
      ly_set_free((ly_set *)siter);
      return 0;
    }
  }
  else {
    if (LVar1 == LYS_CHOICE) {
      _check_when_must = (lyd_node *)0x0;
      if (((toplevel != 0) && (*root != (lyd_node *)0x0)) ||
         ((toplevel == 0 && (subroot != (lyd_node *)0x0)))) {
        if (toplevel == 0) {
          local_70 = subroot->child;
        }
        else {
          local_70 = *root;
        }
        for (_check_when_must = local_70; _check_when_must != (lyd_node *)0x0;
            _check_when_must = _check_when_must->next) {
          siter_prev = lys_parent(_check_when_must->schema);
          iter = (lyd_node *)_check_when_must->schema;
          while( true ) {
            bVar6 = false;
            if (siter_prev != (lys_node *)0x0) {
              bVar6 = (siter_prev->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN;
            }
            if ((!bVar6) || (siter_prev == schema)) break;
            iter = (lyd_node *)siter_prev;
            siter_prev = lys_parent(siter_prev);
          }
          if (siter_prev == schema) break;
        }
      }
      if (_check_when_must == (lyd_node *)0x0) {
        if (schema[1].dsc == (char *)0x0) goto LAB_00193259;
        iVar3 = lyd_wd_add_subtree(root,last_parent,subroot,(lys_node *)schema[1].dsc,toplevel,
                                   options,unres);
      }
      else {
        if ((siter_prev == (lys_node *)0x0) || (iter == (lyd_node *)0x0)) {
          __assert_fail("siter && siter_prev",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                        ,0x1810,
                        "int lyd_wd_add_subtree(struct lyd_node **, struct lyd_node *, struct lyd_node *, struct lys_node *, int, int, struct unres_data *)"
                       );
        }
        iVar3 = lyd_wd_add_subtree(root,last_parent,subroot,(lys_node *)iter,toplevel,options,unres)
        ;
      }
    }
    else {
      if ((LVar1 != LYS_LEAF) && (LVar1 != LYS_LEAFLIST)) {
        if (LVar1 == LYS_LIST) {
          if (subroot == (lyd_node *)0x0) goto LAB_00193259;
          goto LAB_00192d8d;
        }
        if ((((LVar1 != LYS_CASE) && (LVar1 != LYS_NOTIF)) && (LVar1 != LYS_INPUT)) &&
           ((LVar1 != LYS_OUTPUT && (LVar1 != LYS_USES)))) goto LAB_00193259;
        goto LAB_00192e92;
      }
      if (subroot != (lyd_node *)0x0) {
        siter = (lys_node *)ly_set_new();
        if (siter == (lys_node *)0x0) goto LAB_0019326b;
        lyd_get_node_siblings(subroot->child,schema,(ly_set *)siter);
        if (*(uint *)((long)&siter->name + 4) != 0) goto LAB_00193259;
      }
      if (schema->nodetype == LYS_LEAF) {
        iVar3 = lyd_wd_add_leaf(root,last_parent,(lys_node_leaf *)schema,unres,local_60);
        if (iVar3 != 0) {
          return 1;
        }
        goto LAB_00193259;
      }
      iVar3 = lyd_wd_add_leaflist(root,last_parent,(lys_node_leaflist *)schema,unres,local_60);
    }
    if (iVar3 == 0) goto LAB_00193259;
  }
LAB_0019326b:
  ly_set_free((ly_set *)siter);
  return 1;
}

Assistant:

static int
lyd_wd_add_subtree(struct lyd_node **root, struct lyd_node *last_parent, struct lyd_node *subroot,
                   struct lys_node *schema, int toplevel, int options, struct unres_data *unres)
{
    struct ly_set *present = NULL;
    struct lys_node *siter, *siter_prev;
    struct lyd_node *iter;
    int i, check_when_must;

    assert(root);

    if ((options & LYD_OPT_TYPEMASK) && (schema->flags & LYS_CONFIG_R)) {
        /* non LYD_OPT_DATA tree, status data are not expected here */
        return EXIT_SUCCESS;
    }

    if (options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER | LYD_OPT_EDIT | LYD_OPT_GET | LYD_OPT_GETCONFIG)) {
        check_when_must = 0;
    } else {
        check_when_must = 1;
    }

    if (toplevel && (schema->nodetype & (LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_CONTAINER))) {
        /* search for the schema node instance */
        present = ly_set_new();
        if (!present) {
            goto error;
        }
        if ((*root) && lyd_get_node_siblings(*root, schema, present)) {
            /* there are some instances */
            for (i = 0; i < (signed)present->number; i++) {
                if (schema->nodetype & LYS_LEAFLIST) {
                    lyd_wd_leaflist_cleanup(present);
                } else if (schema->nodetype != LYS_LEAF) {
                    if (lyd_wd_add_subtree(root, present->set.d[i], present->set.d[i], schema, 0, options, unres)) {
                        goto error;
                    }
                } /* else LYS_LEAF - nothing to do */
            }
        } else {
            /* no instance */
            if (lyd_wd_add_subtree(root, last_parent, NULL, schema, 0, options, unres)) {
                goto error;
            }
        }

        ly_set_free(present);
        return EXIT_SUCCESS;
    }

    /* skip disabled parts of schema */
    if (!subroot) {
        if (schema->parent && schema->parent->nodetype == LYS_AUGMENT) {
            if (lys_is_disabled(schema->parent, 0)) {
                /* ignore disabled augment */
                return EXIT_SUCCESS;
            }
        }
        if (lys_is_disabled(schema, 0)) {
            /* ignore disabled data */
            return EXIT_SUCCESS;
        }
    }

    switch (schema->nodetype) {
    case LYS_LIST:
        if (!subroot) {
            /* stop recursion */
            break;
        }
        /* no break */
    case LYS_CONTAINER:
        if (!subroot) {
            /* container does not exists, continue only in case of non presence container */
            if (((struct lys_node_container *)schema)->presence) {
                /* stop recursion */
                break;
            }
            /* always create empty NP container even if there is no default node,
             * because accroding to RFC, the empty NP container is always part of
             * accessible tree (e.g. for evaluating when and must conditions) */
            subroot = _lyd_new(last_parent, schema, 1);
            if (!last_parent) {
                if (*root) {
                    lyd_insert_sibling(root, subroot);
                } else {
                    *root = subroot;
                }
            }
            last_parent = subroot;

            /* remember the created container in unres */
            if (check_when_must) {
                if ((subroot->when_status & LYD_WHEN) && unres_data_add(unres, subroot, UNRES_WHEN) == -1) {
                    goto error;
                }
                i = resolve_applies_must(subroot);
                if ((i & 0x1) && (unres_data_add(unres, subroot, UNRES_MUST) == -1)) {
                    goto error;
                }
                if ((i & 0x2) && (unres_data_add(unres, subroot, UNRES_MUST_INOUT) == -1)) {
                    goto error;
                }
            }
        }
        /* no break */
    case LYS_CASE:
    case LYS_USES:
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:

        /* recursion */
        present = ly_set_new();
        if (!present) {
            goto error;
        }
        LY_TREE_FOR(schema->child, siter) {
            if (siter->nodetype & (LYS_CHOICE | LYS_USES)) {
                /* go into without searching for data instance */
                if (lyd_wd_add_subtree(root, last_parent, subroot, siter, toplevel, options, unres)) {
                    goto error;
                }
            } else if (siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA)) {
                /* search for the schema node instance */
                if (subroot && lyd_get_node_siblings(subroot->child, siter, present)) {
                    /* there are some instances in the data root */
                    if (siter->nodetype & LYS_LEAFLIST) {
                        /* already have some leaflists, check that they are all
                         * default, if not, remove the default leaflists */
                        lyd_wd_leaflist_cleanup(present);
                    } else if (siter->nodetype != LYS_LEAF) {
                        /* recursion */
                        for (i = 0; i < (signed)present->number; i++) {
                            if (lyd_wd_add_subtree(root, present->set.d[i], present->set.d[i], siter, toplevel, options,
                                                   unres)) {
                                goto error;
                            }
                        }
                    } /* else LYS_LEAF - nothing to do */
                    ly_set_clean(present);
                } else {
                    /* no instance */
                    if (lyd_wd_add_subtree(root, last_parent, NULL, siter, toplevel, options, unres)) {
                        goto error;
                    }
                }
            }
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
        if (subroot) {
            /* default shortcase of a choice */
            present = ly_set_new();
            if (!present) {
                goto error;
            }
            lyd_get_node_siblings(subroot->child, schema, present);
            if (present->number) {
                /* the shortcase leaf(-list) exists, stop the processing */
                break;
            }
        }
        if (schema->nodetype == LYS_LEAF) {
            if (lyd_wd_add_leaf(root, last_parent, (struct lys_node_leaf*)schema, unres, check_when_must)) {
                return EXIT_FAILURE;
            }
        } else { /* LYS_LEAFLIST */
            if (lyd_wd_add_leaflist(root, last_parent, (struct lys_node_leaflist*)schema, unres, check_when_must)) {
                goto error;
            }
        }
        break;
    case LYS_CHOICE:
        /* get existing node in the data root from the choice */
        iter = NULL;
        if ((toplevel && (*root)) || (!toplevel && subroot)) {
            LY_TREE_FOR(toplevel ? (*root) : subroot->child, iter) {
                for (siter = lys_parent(iter->schema), siter_prev = iter->schema;
                        siter && (siter->nodetype & (LYS_CASE | LYS_USES | LYS_CHOICE));
                        siter_prev = siter, siter = lys_parent(siter)) {
                    if (siter == schema) {
                        /* we have the choice instance */
                        break;
                    }
                }
                if (siter == schema) {
                    /* we have the choice instance;
                     * the condition must be the same as in the loop because of
                     * choice's sibling nodes that break the loop, so siter is not NULL,
                     * but it is not the same as schema */
                    break;
                }
            }
        }
        if (!iter) {
            if (((struct lys_node_choice *)schema)->dflt) {
                /* there is a default case */
                if (lyd_wd_add_subtree(root, last_parent, subroot, ((struct lys_node_choice *)schema)->dflt,
                                       toplevel, options, unres)) {
                    goto error;
                }
            }
        } else {
            /* one of the choice's cases is instantiated, continue into this case */
            /* since iter != NULL, siter must be also != NULL and we also know siter_prev
             * which points to the child of schema leading towards the instantiated data */
            assert(siter && siter_prev);
            if (lyd_wd_add_subtree(root, last_parent, subroot, siter_prev, toplevel, options, unres)) {
                goto error;
            }
        }
        break;
    default:
        /* LYS_ANYXML, LYS_ANYDATA, LYS_USES, LYS_GROUPING - do nothing */
        break;
    }

    ly_set_free(present);
    return EXIT_SUCCESS;

error:
    ly_set_free(present);
    return EXIT_FAILURE;
}